

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

int SET_OF_xer_order(void *aptr,void *bptr)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int ret;
  size_t minlen;
  xer_tmp_enc_t *b;
  xer_tmp_enc_t *a;
  size_t local_30;
  int local_4;
  
  local_30 = in_RDI[1];
  if ((ulong)in_RSI[1] < local_30) {
    local_30 = in_RSI[1];
  }
  local_4 = memcmp((void *)*in_RDI,(void *)*in_RSI,local_30);
  if (local_4 == 0) {
    if (in_RDI[1] == in_RSI[1]) {
      local_4 = 0;
    }
    else if (in_RDI[1] == local_30) {
      local_4 = -1;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int
SET_OF_xer_order(const void *aptr, const void *bptr) {
	const xer_tmp_enc_t *a = (const xer_tmp_enc_t *)aptr;
	const xer_tmp_enc_t *b = (const xer_tmp_enc_t *)bptr;
	size_t minlen = a->offset;
	int ret;
	if(b->offset < minlen) minlen = b->offset;
	/* Well-formed UTF-8 has this nice lexicographical property... */
	ret = memcmp(a->buffer, b->buffer, minlen);
	if(ret != 0) return ret;
	if(a->offset == b->offset)
		return 0;
	if(a->offset == minlen)
		return -1;
	return 1;
}